

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

int __thiscall CVmDynFuncVMIfc::validate_pool_str(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  bVar2 = (byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_;
  uVar5 = (ulong)(ofs >> (bVar2 & 0x1f));
  uVar1 = 0;
  if (uVar5 < G_const_pool_X.super_CVmPoolPaged.page_slots_) {
    if (G_const_pool_X.super_CVmPoolPaged.pages_[uVar5].mem != (char *)0x0) {
      uVar3 = G_const_pool_X.super_CVmPoolPaged._8_4_ - 1;
      if ((ulong)(uVar3 & ofs) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar5].siz) {
        uVar4 = (ulong)(ofs + 1 >> (bVar2 & 0x1f));
        if (uVar4 < G_const_pool_X.super_CVmPoolPaged.page_slots_) {
          if ((G_const_pool_X.super_CVmPoolPaged.pages_[uVar4].mem != (char *)0x0) &&
             ((ulong)(ofs + 1 & uVar3) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar4].siz)) {
            uVar6 = *(ushort *)(G_const_pool_X.super_CVmPoolPaged.pages_[uVar5].mem + (uVar3 & ofs))
                    + ofs + 1;
            uVar5 = (ulong)(uVar6 >> (bVar2 & 0x1f));
            if ((uVar5 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
               (G_const_pool_X.super_CVmPoolPaged.pages_[uVar5].mem != (char *)0x0)) {
              uVar1 = (uint)((ulong)(uVar3 & uVar6) <
                            G_const_pool_X.super_CVmPoolPaged.pages_[uVar5].siz);
            }
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

virtual int validate_pool_str(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        size_t len = vmb_get_len(G_const_pool->get_ptr(ofs));

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(ofs + VMB_LEN + len - 1))
            return FALSE;

        /* success */
        return TRUE;
    }